

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

void __thiscall r_comp::Image::add_sys_object(Image *this,SysObject *object,string *name)

{
  ulong uVar1;
  mapped_type *this_00;
  string *name_local;
  SysObject *object_local;
  Image *this_local;
  
  add_sys_object(this,object);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = std::
              unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&(this->object_names).symbols,(key_type *)(object + 0x68));
    std::__cxx11::string::operator=((string *)this_00,(string *)name);
  }
  return;
}

Assistant:

void Image::add_sys_object(SysObject *object, std::string name)
{
    add_sys_object(object);

    if (!name.empty()) {
        object_names.symbols[object->oid] = name;
    }
}